

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O2

void __thiscall capnp::MallocMessageBuilder::~MallocMessageBuilder(MallocMessageBuilder *this)

{
  void **ppvVar1;
  void **ppvVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  Fault f;
  DebugComparison<const_capnp::word_*,_void_*&> _kjCondition;
  
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_00275cf8;
  if (this->returnedFirstSegment == true) {
    if (this->ownFirstSegment == true) {
      free(this->firstSegment);
    }
    else {
      AVar3 = MessageBuilder::getSegmentsForOutput(&this->super_MessageBuilder);
      if (AVar3.size_ != 0) {
        _kjCondition.left = (AVar3.ptr)->ptr;
        _kjCondition.right = &this->firstSegment;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = _kjCondition.left == (word *)this->firstSegment;
        if (!_kjCondition.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word_const*,void*&>&,char_const(&)[76]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
                     ,0xed,FAILED,"segments[0].begin() == firstSegment",
                     "_kjCondition,\"First segment in getSegmentsForOutput() is not the first segment allocated?\""
                     ,&_kjCondition,
                     (char (*) [76])
                     "First segment in getSegmentsForOutput() is not the first segment allocated?");
          kj::_::Debug::Fault::fatal(&f);
        }
        memset((word *)this->firstSegment,0,(AVar3.ptr)->size_ << 3);
      }
    }
    ppvVar1 = (this->moreSegments).builder.pos;
    for (ppvVar2 = (this->moreSegments).builder.ptr; ppvVar2 != ppvVar1; ppvVar2 = ppvVar2 + 1) {
      free(*ppvVar2);
    }
  }
  kj::ArrayBuilder<void_*>::dispose(&(this->moreSegments).builder);
  FlatMessageBuilder::~FlatMessageBuilder((FlatMessageBuilder *)this);
  return;
}

Assistant:

MallocMessageBuilder::~MallocMessageBuilder() noexcept(false) {
  if (returnedFirstSegment) {
    if (ownFirstSegment) {
      free(firstSegment);
    } else {
      // Must zero first segment.
      kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = getSegmentsForOutput();
      if (segments.size() > 0) {
        KJ_ASSERT(segments[0].begin() == firstSegment,
            "First segment in getSegmentsForOutput() is not the first segment allocated?");
        memset(firstSegment, 0, segments[0].size() * sizeof(word));
      }
    }

    for (void* ptr: moreSegments) {
      free(ptr);
    }
  }
}